

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_mouse_clicked(nk_input *i,nk_buttons id,nk_rect rect)

{
  int iVar1;
  nk_buttons id_local;
  nk_input *i_local;
  nk_rect rect_local;
  
  if (i == (nk_input *)0x0) {
    rect_local.w = 0.0;
  }
  else {
    iVar1 = nk_input_is_mouse_hovering_rect(i,rect);
    if (iVar1 == 0) {
      rect_local.w = 0.0;
    }
    else {
      rect_local.w = (float)nk_input_is_mouse_click_in_rect(i,id,rect);
    }
  }
  return (int)rect_local.w;
}

Assistant:

NK_API int
nk_input_mouse_clicked(const struct nk_input *i, enum nk_buttons id, struct nk_rect rect)
{
    if (!i) return nk_false;
    if (!nk_input_is_mouse_hovering_rect(i, rect)) return nk_false;
    return nk_input_is_mouse_click_in_rect(i, id, rect);
}